

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::FindHelper<true,false>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              int64 length,Arguments *args,ScriptContext *scriptContext)

{
  ThreadContext *pTVar1;
  code *pcVar2;
  ScriptContext *pSVar3;
  bool bVar4;
  int iVar5;
  BOOL BVar6;
  Var pvVar7;
  undefined4 *puVar8;
  undefined4 extraout_var;
  JavascriptMethod p_Var9;
  char16_t *varName;
  uint nValue;
  uint uVar10;
  undefined1 local_90 [8];
  JsReentLock jsReentLock;
  TypedArrayBase *local_68;
  Var element;
  RecyclableObject *local_58;
  undefined1 *local_50;
  TypedArrayBase *local_48;
  RecyclableObject *local_40;
  ScriptContext *local_38;
  
  local_90 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_90)->noJsReentrancy;
  ((ThreadContext *)local_90)->noJsReentrancy = true;
  element = (Var)length;
  local_58 = obj;
  local_48 = typedArrayBase;
  local_38 = scriptContext;
  JsReentLock::setObjectForMutation((JsReentLock *)local_90,pArr);
  if (((ulong)args->Info & 0xfffffe) == 0) {
LAB_00a62c6c:
    varName = L"[TypedArray].prototype.findIndex";
    if (local_48 == (TypedArrayBase *)0x0) {
      varName = L"Array.prototype.findIndex";
    }
    JavascriptError::ThrowTypeError(local_38,-0x7ff5ec34,varName);
  }
  pvVar7 = Arguments::operator[](args,1);
  bVar4 = JavascriptConversion::IsCallable(pvVar7);
  if (!bVar4) goto LAB_00a62c6c;
  uVar10 = 1;
  pvVar7 = Arguments::operator[](args,1);
  local_40 = VarTo<Js::RecyclableObject>(pvVar7);
  if ((*(uint *)&args->Info & 0xffffff) < 3) {
    jsReentLock._24_8_ =
         (((local_38->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
         undefinedValue.ptr;
  }
  else {
    jsReentLock._24_8_ = Arguments::operator[](args,2);
  }
  if (pArr == (JavascriptArray *)0x0 && local_48 == (TypedArrayBase *)0x0) {
    bVar4 = VarIsImpl<Js::TypedArrayBase>(local_58);
    if (bVar4) {
      local_48 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(local_58);
    }
    else {
      local_48 = (TypedArrayBase *)0x0;
    }
  }
  else {
    local_68 = (TypedArrayBase *)0x0;
    if (pArr != (JavascriptArray *)0x0) {
      local_48 = (TypedArrayBase *)
                 (((local_38->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).undefinedValue.ptr;
      if (0xffffffff < (long)element) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2125,"(length <= 0xffffffff)","length <= UINT_MAX");
        if (!bVar4) goto LAB_00a62c91;
        *puVar8 = 0;
      }
      for (; nValue = uVar10 - 1, (long)(ulong)nValue < (long)element; uVar10 = uVar10 + 1) {
        local_68 = local_48;
        *(undefined1 *)((long)local_90 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])
                  (pArr,(ulong)nValue,&local_68);
        JsReentLock::MutateArrayObject((JsReentLock *)local_90);
        *(bool *)((long)local_90 + 0x108) = true;
        local_50 = (undefined1 *)JavascriptNumber::ToVar(nValue,local_38);
        *(undefined1 *)((long)local_90 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pTVar1 = local_38->threadContext;
        bVar4 = pTVar1->reentrancySafeOrHandled;
        pTVar1->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar1);
        ThreadContext::AssertJsReentrancy(local_38->threadContext);
        p_Var9 = RecyclableObject::GetEntryPoint(local_40);
        CheckIsExecutable(local_40,p_Var9);
        p_Var9 = RecyclableObject::GetEntryPoint(local_40);
        pvVar7 = (*p_Var9)(local_40,(CallInfo)local_40,0x2000004,0,0,0,0,0x2000004,
                           jsReentLock._24_8_,local_68,local_50,pArr);
        pTVar1->reentrancySafeOrHandled = bVar4;
        JsReentLock::MutateArrayObject((JsReentLock *)local_90);
        *(bool *)((long)local_90 + 0x108) = true;
        BVar6 = JavascriptConversion::ToBoolean(pvVar7,local_38);
        if (BVar6 != 0) goto LAB_00a62c49;
        bVar4 = IsNonES5Array(local_58);
        if (!bVar4) {
          bVar4 = VarIsImpl<Js::ES5Array>(local_58);
          if (!bVar4) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar8 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                        ,0x2141,"(VarIs<ES5Array>(obj))",
                                        "The array should have been converted to an ES5Array");
            if (!bVar4) goto LAB_00a62c91;
            *puVar8 = 0;
          }
          *(undefined1 *)((long)local_90 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          local_50 = (undefined1 *)
                     FindObjectHelper<true,false>
                               (local_58,(int64)element,(ulong)uVar10,local_40,
                                (Var)jsReentLock._24_8_,local_38);
          goto LAB_00a62c49;
        }
      }
LAB_00a62b78:
      local_50 = &DAT_10000ffffffff;
      goto LAB_00a62c49;
    }
  }
  local_68 = (TypedArrayBase *)0x0;
  if (local_48 == (TypedArrayBase *)0x0) {
    *(undefined1 *)((long)local_90 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    local_50 = (undefined1 *)
               FindObjectHelper<true,false>
                         (local_58,(int64)element,0,local_40,(Var)jsReentLock._24_8_,local_38);
  }
  else {
    if (0xffffffff < (long)element) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2148,"(length <= 0xffffffff)","length <= UINT_MAX");
      if (!bVar4) {
LAB_00a62c91:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
    }
    uVar10 = 0;
    do {
      if ((long)element <= (long)(ulong)uVar10) goto LAB_00a62b78;
      iVar5 = (*(local_48->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x72])(local_48,(ulong)uVar10);
      local_68 = (TypedArrayBase *)CONCAT44(extraout_var,iVar5);
      local_50 = (undefined1 *)JavascriptNumber::ToVar(uVar10,local_38);
      pSVar3 = local_38;
      *(undefined1 *)((long)local_90 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      pTVar1 = local_38->threadContext;
      bVar4 = pTVar1->reentrancySafeOrHandled;
      pTVar1->reentrancySafeOrHandled = true;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar1);
      ThreadContext::AssertJsReentrancy(pSVar3->threadContext);
      p_Var9 = RecyclableObject::GetEntryPoint(local_40);
      CheckIsExecutable(local_40,p_Var9);
      p_Var9 = RecyclableObject::GetEntryPoint(local_40);
      pvVar7 = (*p_Var9)(local_40,(CallInfo)local_40,0x2000004,0,0,0,0,0x2000004,jsReentLock._24_8_,
                         local_68,local_50,local_48);
      pTVar1->reentrancySafeOrHandled = bVar4;
      JsReentLock::MutateArrayObject((JsReentLock *)local_90);
      *(bool *)((long)local_90 + 0x108) = true;
      BVar6 = JavascriptConversion::ToBoolean(pvVar7,local_38);
      uVar10 = uVar10 + 1;
    } while (BVar6 == 0);
  }
LAB_00a62c49:
  *(undefined1 *)((long)local_90 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return local_50;
}

Assistant:

Var JavascriptArray::FindHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, int64 length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            // typedArrayBase is only non-null if and only if we came here via the TypedArray entrypoint
            if (typedArrayBase != nullptr)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, findIndex ? _u("[TypedArray].prototype.findIndex") : _u("[TypedArray].prototype.find"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, findIndex ? _u("Array.prototype.findIndex") : _u("Array.prototype.find"));
            }
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg;

        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        // If we came from Array.prototype.find/findIndex and source object is not a JavascriptArray, source could be a TypedArray
        if (typedArrayBase == nullptr && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        CallFlags flags = CallFlags_Value;
        Var element = nullptr;
        Var testResult = nullptr;
        uint32 loopStart = reversed ? (uint32)length - 1 : 0;
        int8 loopDelta = reversed ? -1 : 1;

        if (pArr)
        {
            Var undefined = scriptContext->GetLibrary()->GetUndefined();

            Assert(length <= UINT_MAX);
            for (uint32 k = loopStart; k < length; k += loopDelta)
            {
                element = undefined;
                JS_REENTRANT(jsReentLock, pArr->DirectGetItemAtFull(k, &element));

                Var index = JavascriptNumber::ToVar(k, scriptContext);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(flags, 4), thisArg,
                                element,
                                index,
                                pArr);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (JavascriptConversion::ToBoolean(testResult, scriptContext))
                {
                    return findIndex ? index : element;
                }

                // Side-effects in the callback function may have changed the source array into an ES5Array. If this happens
                // we will process the rest of the array elements like an ES5Array.
                if (!JavascriptArray::IsNonES5Array(obj))
                {
                    AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
                    JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::FindObjectHelper<findIndex, reversed>(obj, length, k + 1, callBackFn, thisArg, scriptContext));
                }
            }
        }
        else if (typedArrayBase)
        {
            Assert(length <= UINT_MAX);
            for (uint32 k = loopStart; k < length; k+= loopDelta)
            {
                // Spec does not ask to call HasItem, so we need to go to visit the whole length

                element = typedArrayBase->DirectGetItem(k);

                Var index = JavascriptNumber::ToVar(k, scriptContext);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(flags, 4), thisArg,
                            element,
                            index,
                            typedArrayBase);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (JavascriptConversion::ToBoolean(testResult, scriptContext))
                {
                    return findIndex ? index : element;
                }
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::FindObjectHelper<findIndex, reversed>(obj, length, 0u, callBackFn, thisArg, scriptContext));
        }

        return findIndex ? JavascriptNumber::ToVar(-1, scriptContext) : scriptContext->GetLibrary()->GetUndefined();
    }